

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

void __thiscall pbrt::RGBSpectrum::RGBSpectrum(RGBSpectrum *this,RGBColorSpace *cs,RGB *rgb)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar9 [16];
  RGBSigmoidPolynomial RVar10;
  RGB local_18;
  undefined1 auVar8 [56];
  
  (this->rgb).b = rgb->b;
  FVar5 = rgb->g;
  (this->rgb).r = rgb->r;
  (this->rgb).g = FVar5;
  this->illuminant = &cs->illuminant;
  auVar6 = vmaxss_avx(ZEXT416((uint)rgb->g),ZEXT416((uint)rgb->r));
  auVar6 = vmaxss_avx(ZEXT416((uint)rgb->b),auVar6);
  fVar4 = auVar6._0_4_ + auVar6._0_4_;
  auVar6 = ZEXT816(0) << 0x20;
  this->scale = fVar4;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    uVar1 = rgb->r;
    uVar3 = rgb->g;
    auVar6._4_4_ = uVar3;
    auVar6._0_4_ = uVar1;
    auVar6._8_8_ = 0;
    auVar9._4_4_ = fVar4;
    auVar9._0_4_ = fVar4;
    auVar9._8_4_ = fVar4;
    auVar9._12_4_ = fVar4;
    auVar9 = vdivps_avx(auVar6,auVar9);
    auVar6 = ZEXT416((uint)(rgb->b / fVar4));
  }
  else {
    auVar9 = ZEXT816(0);
  }
  auVar8 = ZEXT856(auVar6._8_8_);
  local_18._0_8_ = vmovlps_avx(auVar9);
  local_18.b = auVar6._0_4_;
  RVar10 = RGBColorSpace::ToRGBCoeffs(cs,&local_18);
  auVar7._0_8_ = RVar10._0_8_;
  auVar7._8_56_ = auVar8;
  uVar2 = vmovlps_avx(auVar7._0_16_);
  (this->rsp).c0 = (Float)(int)uVar2;
  (this->rsp).c1 = (Float)(int)((ulong)uVar2 >> 0x20);
  (this->rsp).c2 = RVar10.c2;
  return;
}

Assistant:

RGBSpectrum::RGBSpectrum(const RGBColorSpace &cs, const RGB &rgb)
    : rgb(rgb), illuminant(&cs.illuminant) {
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    scale = 2 * m;
    rsp = cs.ToRGBCoeffs(scale ? rgb / scale : RGB(0, 0, 0));
}